

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<QDnsServiceRecord>::erase
          (QMovableArrayOps<QDnsServiceRecord> *this,QDnsServiceRecord *b,qsizetype n)

{
  qsizetype *pqVar1;
  QDnsServiceRecord *pQVar2;
  QDnsServiceRecord *pQVar3;
  long lVar4;
  
  if (n != 0) {
    lVar4 = n * 8;
    pQVar3 = b;
    do {
      QDnsServiceRecord::~QDnsServiceRecord(pQVar3);
      pQVar3 = pQVar3 + 1;
      lVar4 = lVar4 + -8;
    } while (lVar4 != 0);
  }
  pQVar3 = b + n;
  pQVar2 = (this->super_QGenericArrayOps<QDnsServiceRecord>).
           super_QArrayDataPointer<QDnsServiceRecord>.ptr;
  if ((pQVar2 == b) &&
     (pQVar3 != pQVar2 + (this->super_QGenericArrayOps<QDnsServiceRecord>).
                         super_QArrayDataPointer<QDnsServiceRecord>.size)) {
    (this->super_QGenericArrayOps<QDnsServiceRecord>).super_QArrayDataPointer<QDnsServiceRecord>.ptr
         = pQVar3;
  }
  else if (pQVar3 != pQVar2 + (this->super_QGenericArrayOps<QDnsServiceRecord>).
                              super_QArrayDataPointer<QDnsServiceRecord>.size) {
    memmove(b,pQVar3,(long)(pQVar2 + (this->super_QGenericArrayOps<QDnsServiceRecord>).
                                     super_QArrayDataPointer<QDnsServiceRecord>.size) - (long)pQVar3
           );
  }
  pqVar1 = &(this->super_QGenericArrayOps<QDnsServiceRecord>).
            super_QArrayDataPointer<QDnsServiceRecord>.size;
  *pqVar1 = *pqVar1 - n;
  return;
}

Assistant:

void erase(T *b, qsizetype n)
    {
        T *e = b + n;

        Q_ASSERT(this->isMutable());
        Q_ASSERT(b < e);
        Q_ASSERT(b >= this->begin() && b < this->end());
        Q_ASSERT(e > this->begin() && e <= this->end());

        // Comply with std::vector::erase(): erased elements and all after them
        // are invalidated. However, erasing from the beginning effectively
        // means that all iterators are invalidated. We can use this freedom to
        // erase by moving towards the end.

        std::destroy(b, e);
        if (b == this->begin() && e != this->end()) {
            this->ptr = e;
        } else if (e != this->end()) {
            memmove(static_cast<void *>(b), static_cast<const void *>(e), (static_cast<const T *>(this->end()) - e)*sizeof(T));
        }
        this->size -= n;
    }